

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O3

int mmdelm_(int *mdnode,int *xadj,int *adjncy,int *dhead,int *dforw,int *dbakw,int *qsize,int *llist
           ,int *marker,int *maxint,int *tag)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  piVar3 = dforw + -1;
  marker[(long)*mdnode + -1] = *tag;
  iVar10 = xadj[(long)*mdnode + -1];
  iVar8 = xadj[*mdnode];
  iVar7 = iVar8 + -1;
  iVar12 = iVar8 - iVar10;
  if (iVar10 < iVar8) {
    lVar5 = (long)iVar10;
    lVar11 = 0;
    uVar4 = 0;
    do {
      uVar1 = adjncy[lVar5 + lVar11 + -1];
      lVar9 = (long)(int)uVar1;
      if (lVar9 == 0) break;
      if (marker[lVar9 + -1] < *tag) {
        marker[lVar9 + -1] = *tag;
        if (piVar3[lVar9] < 0) {
          llist[lVar9 + -1] = uVar4;
          uVar4 = uVar1;
        }
        else {
          adjncy[(long)iVar10 + -1] = uVar1;
          iVar10 = iVar10 + 1;
        }
      }
      lVar11 = lVar11 + 1;
    } while (iVar12 != (int)lVar11);
    for (; 0 < (int)uVar4; uVar4 = llist[(ulong)uVar4 - 1]) {
      adjncy[(long)iVar7 + -1] = -uVar4;
      iVar12 = xadj[uVar4];
      for (iVar8 = xadj[(ulong)uVar4 - 1]; iVar8 < iVar12; iVar8 = xadj[(ulong)(uint)-iVar8 - 1]) {
        lVar5 = (long)iVar8;
        while( true ) {
          iVar8 = adjncy[lVar5 + -1];
          lVar11 = (long)iVar8;
          if (lVar11 < 0) break;
          if (iVar8 == 0) goto LAB_00143595;
          if ((marker[lVar11 + -1] < *tag) && (-1 < piVar3[lVar11])) {
            marker[lVar11 + -1] = *tag;
            for (; iVar7 <= iVar10; iVar7 = xadj[(long)(1 - adjncy[(long)iVar7 + -1]) + -1] + -1) {
              iVar10 = xadj[-1 - (long)adjncy[(long)iVar7 + -1]];
            }
            adjncy[(long)iVar10 + -1] = iVar8;
            iVar10 = iVar10 + 1;
          }
          lVar5 = lVar5 + 1;
          if (iVar12 <= lVar5) goto LAB_00143595;
        }
        iVar12 = xadj[(uint)-iVar8];
      }
LAB_00143595:
    }
  }
  if (iVar10 <= iVar7) {
    adjncy[(long)iVar10 + -1] = 0;
  }
  iVar7 = xadj[(long)*mdnode + -1];
  iVar10 = xadj[*mdnode];
  if (iVar7 < iVar10) {
    do {
      lVar5 = (long)iVar7;
      while( true ) {
        iVar8 = adjncy[lVar5 + -1];
        lVar11 = (long)iVar8;
        if (lVar11 < 0) break;
        if (iVar8 == 0) {
          return 0;
        }
        uVar4 = dbakw[lVar11 + -1];
        if ((uVar4 != 0) && (*maxint + uVar4 != 0)) {
          iVar7 = piVar3[lVar11];
          if (0 < (long)iVar7) {
            dbakw[(long)iVar7 + -1] = uVar4;
          }
          uVar1 = -uVar4;
          if (0 < (int)uVar4) {
            uVar1 = uVar4;
          }
          piVar6 = dhead + -1;
          if (0 < (int)uVar4) {
            piVar6 = piVar3;
          }
          piVar6[uVar1] = iVar7;
        }
        iVar7 = xadj[lVar11 + -1];
        iVar8 = xadj[lVar11];
        iVar12 = iVar7;
        if (iVar7 < iVar8) {
          lVar9 = 0;
          do {
            iVar2 = adjncy[(long)iVar7 + lVar9 + -1];
            if ((long)iVar2 == 0) break;
            if (marker[(long)iVar2 + -1] < *tag) {
              adjncy[(long)iVar12 + -1] = iVar2;
              iVar12 = iVar12 + 1;
            }
            lVar9 = lVar9 + 1;
          } while (iVar8 - iVar7 != (int)lVar9);
        }
        if (iVar12 - iVar7 == 0 || iVar12 < iVar7) {
          qsize[(long)*mdnode + -1] = qsize[(long)*mdnode + -1] + qsize[lVar11 + -1];
          qsize[lVar11 + -1] = 0;
          marker[lVar11 + -1] = *maxint;
          piVar3[lVar11] = -*mdnode;
          dbakw[lVar11 + -1] = -*maxint;
        }
        else {
          piVar3[lVar11] = (iVar12 - iVar7) + 1;
          dbakw[lVar11 + -1] = 0;
          adjncy[(long)iVar12 + -1] = *mdnode;
          if (iVar12 < iVar8 + -1) {
            adjncy[iVar12] = 0;
          }
        }
        lVar5 = lVar5 + 1;
        if (iVar10 <= lVar5) {
          return 0;
        }
      }
      iVar7 = xadj[(ulong)(uint)-iVar8 - 1];
      iVar10 = xadj[(uint)-iVar8];
    } while (iVar7 < iVar10);
  }
  return 0;
}

Assistant:

int mmdelm_(int* mdnode, int* xadj, int* adjncy, int* dhead, int* dforw,
            int* dbakw, int* qsize, int* llist, int* marker,
            int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr,
            istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L300;
        }
        if (marker[nabor] >= *tag) {
            goto L200;
        }
        marker[nabor] = *tag;
        if (dforw[nabor] < 0) {
            goto L100;
        }
        adjncy[rloc] = nabor;
        ++rloc;
        goto L200;
L100:
        llist[nabor] = elmnt;
        elmnt = nabor;
L200:
        ;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
        goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
        node = adjncy[j];
        link = -node;
        if (node < 0) {
            goto L400;
        } else if (node == 0) {
            goto L900;
        } else {
            goto L500;
        }
L500:
        if (marker[node] >= *tag || dforw[node] < 0) {
            goto L800;
        }
        marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
        if (rloc < rlmt) {
            goto L700;
        }
        link = -adjncy[rlmt];
        rloc = xadj[link];
        rlmt = xadj[link + 1] - 1;
        goto L600;
L700:
        adjncy[rloc] = node;
        ++rloc;
L800:
        ;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
        adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        rnode = adjncy[i];
        link = -rnode;
        if (rnode < 0) {
            goto L1100;
        } else if (rnode == 0) {
            goto L1800;
        } else {
            goto L1200;
        }
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
        pvnode = dbakw[rnode];
        if (pvnode == 0 || pvnode == -(*maxint)) {
            goto L1300;
        }
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
        nxnode = dforw[rnode];
        if (nxnode > 0) {
            dbakw[nxnode] = pvnode;
        }
        if (pvnode > 0) {
            dforw[pvnode] = nxnode;
        }
        npv = -pvnode;
        if (pvnode < 0) {
            dhead[npv] = nxnode;
        }
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
        jstrt = xadj[rnode];
        jstop = xadj[rnode + 1] - 1;
        xqnbr = jstrt;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            nabor = adjncy[j];
            if (nabor == 0) {
                goto L1500;
            }
            if (marker[nabor] >= *tag) {
                goto L1400;
            }
            adjncy[xqnbr] = nabor;
            ++xqnbr;
L1400:
            ;
        }
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
        nqnbrs = xqnbr - jstrt;
        if (nqnbrs > 0) {
            goto L1600;
        }
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
        qsize[*mdnode] += qsize[rnode];
        qsize[rnode] = 0;
        marker[rnode] = *maxint;
        dforw[rnode] = -(*mdnode);
        dbakw[rnode] = -(*maxint);
        goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
        dforw[rnode] = nqnbrs + 1;
        dbakw[rnode] = 0;
        adjncy[xqnbr] = *mdnode;
        ++xqnbr;
        if (xqnbr <= jstop) {
            adjncy[xqnbr] = 0;
        }

L1700:
        ;
    }
L1800:
    return 0;

}